

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::TabBarProcessReorder(ImGuiTabBar *tab_bar)

{
  short sVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  ImGuiID IVar7;
  ImGuiTabItemFlags IVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ImGuiTabItem *pIVar12;
  uint uVar13;
  ImGuiTabItem *__src;
  ImGuiTabItem *__dest;
  ImGuiTabItem *pIVar14;
  ImGuiTabItem item_tmp;
  
  pIVar12 = TabBarFindTabByID(tab_bar,tab_bar->ReorderRequestTabId);
  if ((pIVar12 != (ImGuiTabItem *)0x0) && ((pIVar12->Flags & 0x20U) == 0)) {
    pIVar14 = (tab_bar->Tabs).Data;
    sVar1 = tab_bar->ReorderRequestOffset;
    uVar13 = (uint)sVar1;
    uVar11 = (int)(((long)pIVar12 - (long)pIVar14) / 0x2c) + uVar13;
    if ((-1 < (int)uVar11) && ((int)uVar11 < (tab_bar->Tabs).Size)) {
      if (((pIVar14[uVar11].Flags & 0x20U) == 0) &&
         (((pIVar14[uVar11].Flags ^ pIVar12->Flags) & 0xc0U) == 0)) {
        pIVar14 = pIVar14 + uVar11;
        IVar7 = pIVar12->ID;
        IVar8 = pIVar12->Flags;
        iVar9 = pIVar12->LastFrameVisible;
        iVar10 = pIVar12->LastFrameSelected;
        fVar5 = pIVar12->Offset;
        fVar6 = pIVar12->Width;
        uVar2._0_4_ = pIVar12->ContentWidth;
        uVar2._4_4_ = pIVar12->RequestedWidth;
        uVar3 = pIVar12->NameOffset;
        uVar4._0_2_ = pIVar12->BeginOrder;
        uVar4._2_2_ = pIVar12->IndexDuringLayout;
        uVar4._4_1_ = pIVar12->WantClose;
        uVar4._5_3_ = *(undefined3 *)&pIVar12->field_0x29;
        item_tmp._36_5_ = SUB85(uVar4,0);
        __src = pIVar12 + 1;
        if (sVar1 < 1) {
          __src = pIVar14;
        }
        __dest = pIVar14 + 1;
        if (0 < sVar1) {
          __dest = pIVar12;
        }
        uVar11 = -uVar13;
        if (0 < (int)uVar13) {
          uVar11 = uVar13;
        }
        memmove(__dest,__src,(ulong)uVar11 * 0x2c);
        item_tmp.NameOffset._0_1_ = (undefined1)uVar3;
        item_tmp.NameOffset._1_3_ = (undefined3)((uint)uVar3 >> 8);
        *(ulong *)((long)&pIVar14->ContentWidth + 1) =
             CONCAT17((undefined1)item_tmp.NameOffset,(int7)((ulong)uVar2 >> 8));
        *(ulong *)((long)&pIVar14->NameOffset + 1) =
             CONCAT53(item_tmp._36_5_,item_tmp.NameOffset._1_3_);
        pIVar14->Offset = fVar5;
        pIVar14->Width = fVar6;
        pIVar14->ContentWidth = (float)(undefined4)uVar2;
        pIVar14->RequestedWidth = (float)uVar2._4_4_;
        pIVar14->ID = IVar7;
        pIVar14->Flags = IVar8;
        pIVar14->LastFrameVisible = iVar9;
        pIVar14->LastFrameSelected = iVar10;
        if ((tab_bar->Flags & 0x400000) != 0) {
          MarkIniSettingsDirty();
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ImGui::TabBarProcessReorder(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId);
    if (tab1 == NULL || (tab1->Flags & ImGuiTabItemFlags_NoReorder))
        return false;

    //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
    int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestOffset;
    if (tab2_order < 0 || tab2_order >= tab_bar->Tabs.Size)
        return false;

    // Reordered tabs must share the same section
    // (Note: TabBarQueueReorderFromMousePos() also has a similar test but since we allow direct calls to TabBarQueueReorder() we do it here too)
    ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
    if (tab2->Flags & ImGuiTabItemFlags_NoReorder)
        return false;
    if ((tab1->Flags & ImGuiTabItemFlags_SectionMask_) != (tab2->Flags & ImGuiTabItemFlags_SectionMask_))
        return false;

    ImGuiTabItem item_tmp = *tab1;
    ImGuiTabItem* src_tab = (tab_bar->ReorderRequestOffset > 0) ? tab1 + 1 : tab2;
    ImGuiTabItem* dst_tab = (tab_bar->ReorderRequestOffset > 0) ? tab1 : tab2 + 1;
    const int move_count = (tab_bar->ReorderRequestOffset > 0) ? tab_bar->ReorderRequestOffset : -tab_bar->ReorderRequestOffset;
    memmove(dst_tab, src_tab, move_count * sizeof(ImGuiTabItem));
    *tab2 = item_tmp;

    if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
        MarkIniSettingsDirty();
    return true;
}